

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_dirty_update_flush
               (filemgr *file,filemgr_dirty_update_node *node,err_log_callback *log_callback)

{
  int iVar1;
  err_log_callback *buf;
  bid_t in_RDX;
  filemgr *in_RSI;
  filemgr *in_RDI;
  filemgr_dirty_update_block *block;
  avl_node *a;
  err_log_callback *log_callback_00;
  
  if (in_RSI != (filemgr *)0x0) {
    buf = (err_log_callback *)avl_first((avl_tree *)&in_RSI->num_invalidated_blocks);
    while (log_callback_00 = buf, log_callback_00 != (err_log_callback *)0x0) {
      buf = (err_log_callback *)avl_next((avl_node *)log_callback_00);
      iVar1 = filemgr_is_writable(in_RDI,(bid_t)in_RSI);
      if ((iVar1 != 0) && (((ulong)log_callback_00[1].ctx_data & 1) == 0)) {
        filemgr_write(in_RSI,in_RDX,buf,log_callback_00);
      }
    }
    *(undefined1 *)((long)&(in_RSI->latest_filesize).super___atomic_base<unsigned_long>._M_i + 1) =
         1;
  }
  return;
}

Assistant:

INLINE void filemgr_dirty_update_flush(struct filemgr *file,
                                       struct filemgr_dirty_update_node *node,
                                       err_log_callback *log_callback)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block;

    if (!node) {
        return;
    }

    // Flush all dirty blocks belonging to this dirty update entry
    a = avl_first(&node->dirty_blocks);
    while (a) {
        block = _get_entry(a, struct filemgr_dirty_update_block, avl);
        a = avl_next(a);
        if (filemgr_is_writable(file, block->bid) && !block->immutable) {
            filemgr_write(file, block->bid, block->addr, log_callback);
        }
    }
    node->expired = true;
}